

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O3

void enet_peer_setup_outgoing_command(ENetPeer *peer,ENetOutgoingCommand *outgoingCommand)

{
  byte bVar1;
  ushort uVar2;
  size_t sVar3;
  ushort uVar4;
  byte bVar5;
  ushort *puVar6;
  
  puVar6 = (ushort *)
           ((long)peer->channels->reliableWindows +
           ((ulong)((uint)(outgoingCommand->command).header.channelID * 0x50) - 6));
  sVar3 = enet_protocol_command_size((outgoingCommand->command).header.command);
  peer->outgoingDataTotal =
       peer->outgoingDataTotal + (int)sVar3 + (uint)outgoingCommand->fragmentLength;
  if ((outgoingCommand->command).header.channelID == 0xff) {
    uVar4 = (short)*(undefined4 *)&peer->outgoingReliableSequenceNumber + 1;
    peer->outgoingReliableSequenceNumber = uVar4;
LAB_001045b1:
    uVar2 = 0;
  }
  else {
    bVar1 = (outgoingCommand->command).header.command;
    if ((char)bVar1 < '\0') {
      uVar4 = (short)*(undefined4 *)puVar6 + 1;
      *puVar6 = uVar4;
      puVar6[1] = 0;
      goto LAB_001045b1;
    }
    if (0x3f < bVar1) {
      peer->outgoingUnsequencedGroup = peer->outgoingUnsequencedGroup + 1;
      uVar4 = 0;
      goto LAB_001045b1;
    }
    uVar2 = puVar6[1];
    if (outgoingCommand->fragmentOffset == 0) {
      uVar2 = uVar2 + 1;
      puVar6[1] = uVar2;
    }
    uVar4 = *puVar6;
  }
  outgoingCommand->reliableSequenceNumber = uVar4;
  outgoingCommand->unreliableSequenceNumber = uVar2;
  outgoingCommand->sendAttempts = 0;
  outgoingCommand->sentTime = 0;
  outgoingCommand->roundTripTimeout = 0;
  outgoingCommand->roundTripTimeoutLimit = 0;
  (outgoingCommand->command).header.reliableSequenceNumber = uVar4 << 8 | uVar4 >> 8;
  bVar1 = (outgoingCommand->command).header.command;
  bVar5 = bVar1 & 0xf;
  if (bVar5 != 7) {
    if (bVar5 != 9) goto LAB_001045fb;
    uVar2 = peer->outgoingUnsequencedGroup;
  }
  (outgoingCommand->command).acknowledge.receivedReliableSequenceNumber = uVar2 << 8 | uVar2 >> 8;
LAB_001045fb:
  enet_list_insert((ENetListIterator)
                   (peer->unsequencedWindow + (ulong)(-1 < (char)bVar1) * 4 + -0xe),outgoingCommand)
  ;
  return;
}

Assistant:

void
enet_peer_setup_outgoing_command (ENetPeer * peer, ENetOutgoingCommand * outgoingCommand)
{
    ENetChannel * channel = & peer -> channels [outgoingCommand -> command.header.channelID];
    
    peer -> outgoingDataTotal += enet_protocol_command_size (outgoingCommand -> command.header.command) + outgoingCommand -> fragmentLength;

    if (outgoingCommand -> command.header.channelID == 0xFF)
    {
       ++ peer -> outgoingReliableSequenceNumber;

       outgoingCommand -> reliableSequenceNumber = peer -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)
    {
       ++ channel -> outgoingReliableSequenceNumber;
       channel -> outgoingUnreliableSequenceNumber = 0;

       outgoingCommand -> reliableSequenceNumber = channel -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED)
    {
       ++ peer -> outgoingUnsequencedGroup;

       outgoingCommand -> reliableSequenceNumber = 0;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    {
       if (outgoingCommand -> fragmentOffset == 0)
         ++ channel -> outgoingUnreliableSequenceNumber;
        
       outgoingCommand -> reliableSequenceNumber = channel -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = channel -> outgoingUnreliableSequenceNumber;
    }
   
    outgoingCommand -> sendAttempts = 0;
    outgoingCommand -> sentTime = 0;
    outgoingCommand -> roundTripTimeout = 0;
    outgoingCommand -> roundTripTimeoutLimit = 0;
    outgoingCommand -> command.header.reliableSequenceNumber = ENET_HOST_TO_NET_16 (outgoingCommand -> reliableSequenceNumber);

    switch (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK)
    {
    case ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE:
        outgoingCommand -> command.sendUnreliable.unreliableSequenceNumber = ENET_HOST_TO_NET_16 (outgoingCommand -> unreliableSequenceNumber);
        break;

    case ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED:
        outgoingCommand -> command.sendUnsequenced.unsequencedGroup = ENET_HOST_TO_NET_16 (peer -> outgoingUnsequencedGroup);
        break;
    
    default:
        break;
    }

    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)
      enet_list_insert (enet_list_end (& peer -> outgoingReliableCommands), outgoingCommand);
    else
      enet_list_insert (enet_list_end (& peer -> outgoingUnreliableCommands), outgoingCommand);
}